

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int init_compatible_string_p(node_t_conflict n,type *el_type)

{
  node_code_t nVar1;
  int iVar2;
  uint uVar3;
  
  nVar1 = n->code;
  uVar3 = 0;
  if (nVar1 == N_STR32) {
    if (el_type->mode == TM_BASIC) {
      uVar3 = (uint)((el_type->u).basic_type == TP_UINT);
    }
  }
  else {
    if (nVar1 == N_STR16) {
      if (el_type->mode != TM_BASIC) {
        return 0;
      }
      if ((el_type->u).basic_type != TP_USHORT) {
        return 0;
      }
    }
    else {
      if (nVar1 != N_STR) {
        return 0;
      }
      iVar2 = char_type_p(el_type);
      if (iVar2 == 0) {
        return 0;
      }
    }
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

static int init_compatible_string_p (node_t n, struct type *el_type) {
  return ((n->code == N_STR && char_type_p (el_type))
          || (n->code == N_STR16 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (2))
          || (n->code == N_STR32 && el_type->mode == TM_BASIC
              && el_type->u.basic_type == get_uint_basic_type (4)));
}